

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validExrFile.cpp
# Opt level: O2

bool isComplete(char *fileName)

{
  undefined1 uVar1;
  int iVar2;
  InputFile in;
  InputFile local_30 [32];
  
  iVar2 = Imf_3_4::globalThreadCount();
  Imf_3_4::InputFile::InputFile(local_30,fileName,iVar2);
  uVar1 = Imf_3_4::InputFile::isComplete();
  Imf_3_4::InputFile::~InputFile(local_30);
  return (bool)uVar1;
}

Assistant:

bool
isComplete (const char fileName[])
{
    InputFile in (fileName);
    return in.isComplete();
}